

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_persistconninfo(Curl_easy *data,connectdata *conn,char *param_3,int param_4)

{
  int local_port_local;
  char *local_ip_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  memcpy((data->info).conn_primary_ip,conn->primary_ip,0x2e);
  if ((param_3 == (char *)0x0) || (*param_3 == '\0')) {
    (data->info).conn_local_ip[0] = '\0';
  }
  else {
    memcpy((data->info).conn_local_ip,param_3,0x2e);
  }
  (data->info).conn_scheme = conn->handler->scheme;
  (data->info).conn_protocol = conn->handler->protocol & 0x3ffffff;
  (data->info).conn_primary_port = conn->port;
  (data->info).conn_remote_port = conn->remote_port;
  (data->info).conn_local_port = param_4;
  return;
}

Assistant:

void Curl_persistconninfo(struct Curl_easy *data, struct connectdata *conn,
                          char *local_ip, int local_port)
{
  memcpy(data->info.conn_primary_ip, conn->primary_ip, MAX_IPADR_LEN);
  if(local_ip && local_ip[0])
    memcpy(data->info.conn_local_ip, local_ip, MAX_IPADR_LEN);
  else
    data->info.conn_local_ip[0] = 0;
  data->info.conn_scheme = conn->handler->scheme;
  /* conn_protocol can only provide "old" protocols */
  data->info.conn_protocol = (conn->handler->protocol) & CURLPROTO_MASK;
  data->info.conn_primary_port = conn->port;
  data->info.conn_remote_port = conn->remote_port;
  data->info.conn_local_port = local_port;
}